

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  stbtt_uint32 in_R9D;
  
  uVar3 = *(ushort *)(data + (ulong)fontstart + 4) << 8 |
          *(ushort *)(data + (ulong)fontstart + 4) >> 8;
  if (uVar3 != 0) {
    uVar5 = (ulong)uVar3;
    uVar4 = fontstart + 0xc;
    do {
      bVar2 = true;
      if (((((uint)data[uVar4] == (int)*tag) && ((uint)data[(ulong)uVar4 + 1] == (int)tag[1])) &&
          ((uint)data[(ulong)uVar4 + 2] == (int)tag[2])) &&
         ((uint)data[(ulong)uVar4 + 3] == (int)tag[3])) {
        uVar1 = *(uint *)(data + (ulong)uVar4 + 8);
        in_R9D = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        bVar2 = false;
      }
      if (!bVar2) {
        return in_R9D;
      }
      uVar4 = uVar4 + 0x10;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return 0;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}